

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_spec.hpp
# Opt level: O0

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  Pattern *pPVar3;
  __normal_iterator<const_Catch::Ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>_>
  local_30;
  const_iterator itEnd;
  const_iterator it;
  TestCaseInfo *testCase_local;
  Filter *this_local;
  
  itEnd = std::
          vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
          ::begin(&this->m_patterns);
  local_30._M_current =
       (Ptr<Catch::TestSpec::Pattern> *)
       std::
       vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
       ::end(&this->m_patterns);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_30);
    if (!bVar1) {
      return true;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>_>
              ::operator*(&itEnd);
    pPVar3 = Ptr<Catch::TestSpec::Pattern>::operator->(this_00);
    uVar2 = (*(pPVar3->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[4])(pPVar3,testCase);
    if ((uVar2 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(&itEnd);
  }
  return false;
}

Assistant:

bool matches( TestCaseInfo const& testCase ) const {
                // All patterns in a filter must match for the filter to be a match
                for( std::vector<Ptr<Pattern> >::const_iterator it = m_patterns.begin(), itEnd = m_patterns.end(); it != itEnd; ++it )
                    if( !(*it)->matches( testCase ) )
                        return false;
                    return true;
            }